

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O2

void __thiscall aeron::ClientConductor::onCheckManagedResources(ClientConductor *this,longlong now)

{
  ImageListLingerDefn *pIVar1;
  ImageList *pIVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  const_iterator __first;
  LogBuffersLingerDefn *pLVar6;
  __normal_iterator<aeron::ClientConductor::ImageListLingerDefn_*,_std::vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>_>
  _Var7;
  long lVar8;
  __normal_iterator<aeron::ClientConductor::ImageListLingerDefn_*,_std::vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>_>
  __first_00;
  const_iterator __last;
  ImageListLingerDefn *pIVar9;
  longlong local_50;
  ClientConductor *local_48;
  longlong local_40;
  ClientConductor *local_38;
  
  std::recursive_mutex::lock(&this->m_adminLock);
  pLVar6 = (this->m_lingeringLogBuffers).
           super__Vector_base<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->m_lingeringLogBuffers).
       super__Vector_base<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)__last._M_current - (long)pLVar6;
  lVar8 = this->m_resourceLingerTimeoutMs;
  for (lVar4 = lVar5 / 0x18 >> 2; 0 < lVar4; lVar4 = lVar4 + -1) {
    __first._M_current = pLVar6;
    if (pLVar6->m_timeOfLastStatusChange + lVar8 < now) goto LAB_0014beb8;
    if (pLVar6[1].m_timeOfLastStatusChange + lVar8 < now) {
      __first._M_current = pLVar6 + 1;
      goto LAB_0014beb8;
    }
    if (pLVar6[2].m_timeOfLastStatusChange + lVar8 < now) {
      __first._M_current = pLVar6 + 2;
      goto LAB_0014beb8;
    }
    if (pLVar6[3].m_timeOfLastStatusChange + lVar8 < now) {
      __first._M_current = pLVar6 + 3;
      goto LAB_0014beb8;
    }
    pLVar6 = pLVar6 + 4;
    lVar5 = lVar5 + -0x60;
  }
  lVar5 = lVar5 / 0x18;
  if (lVar5 == 1) {
LAB_0014be9b:
    __first._M_current = pLVar6;
    if (now <= lVar8 + pLVar6->m_timeOfLastStatusChange) {
      __first._M_current = __last._M_current;
    }
LAB_0014beb8:
    pLVar6 = __first._M_current;
    if (__first._M_current != __last._M_current) {
      do {
        do {
          pLVar6 = pLVar6 + 1;
          if (pLVar6 == __last._M_current) {
            __last._M_current =
                 (this->m_lingeringLogBuffers).
                 super__Vector_base<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            goto LAB_0014bf01;
          }
        } while (pLVar6->m_timeOfLastStatusChange + this->m_resourceLingerTimeoutMs < now);
        LogBuffersLingerDefn::operator=(__first._M_current,pLVar6);
        __first._M_current = __first._M_current + 1;
      } while( true );
    }
  }
  else {
    if (lVar5 == 2) {
LAB_0014be8b:
      __first._M_current = pLVar6;
      if (now <= pLVar6->m_timeOfLastStatusChange + lVar8) {
        pLVar6 = pLVar6 + 1;
        goto LAB_0014be9b;
      }
      goto LAB_0014beb8;
    }
    __first._M_current = __last._M_current;
    if (lVar5 == 3) {
      __first._M_current = pLVar6;
      if (now <= pLVar6->m_timeOfLastStatusChange + lVar8) {
        pLVar6 = pLVar6 + 1;
        goto LAB_0014be8b;
      }
      goto LAB_0014beb8;
    }
  }
LAB_0014bf01:
  std::
  vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
  ::erase(&this->m_lingeringLogBuffers,__first,__last);
  _Var7._M_current =
       (this->m_lingeringImageLists).
       super__Vector_base<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (this->m_lingeringImageLists).
           super__Vector_base<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)pIVar1 - (long)_Var7._M_current;
  local_50 = now;
  local_48 = this;
  local_40 = now;
  local_38 = this;
  for (lVar4 = lVar8 >> 6; 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::operator()
                      ((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                        *)&local_50,_Var7);
    __first_00._M_current = _Var7._M_current;
    if (bVar3) goto LAB_0014c020;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::operator()
                      ((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                        *)&local_50,_Var7._M_current + 1);
    __first_00._M_current = _Var7._M_current + 1;
    if (bVar3) goto LAB_0014c020;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::operator()
                      ((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                        *)&local_50,_Var7._M_current + 2);
    __first_00._M_current = _Var7._M_current + 2;
    if (bVar3) goto LAB_0014c020;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::operator()
                      ((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                        *)&local_50,_Var7._M_current + 3);
    __first_00._M_current = _Var7._M_current + 3;
    if (bVar3) goto LAB_0014c020;
    _Var7._M_current = _Var7._M_current + 4;
    lVar8 = lVar8 + -0x40;
  }
  lVar8 = lVar8 >> 4;
  if (lVar8 == 1) {
LAB_0014c001:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::operator()
                      ((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                        *)&local_50,_Var7);
    __first_00._M_current = _Var7._M_current;
    if (!bVar3) {
      __first_00._M_current = pIVar1;
    }
  }
  else if (lVar8 == 2) {
LAB_0014bfec:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::operator()
                      ((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                        *)&local_50,_Var7);
    __first_00._M_current = _Var7._M_current;
    if (!bVar3) {
      _Var7._M_current = _Var7._M_current + 1;
      goto LAB_0014c001;
    }
  }
  else {
    __first_00._M_current = pIVar1;
    if (lVar8 != 3) goto LAB_0014c05c;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::operator()
                      ((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                        *)&local_50,_Var7);
    __first_00._M_current = _Var7._M_current;
    if (!bVar3) {
      _Var7._M_current = _Var7._M_current + 1;
      goto LAB_0014bfec;
    }
  }
LAB_0014c020:
  if (__first_00._M_current != pIVar1) {
    _Var7._M_current = __first_00._M_current;
    while (pIVar9 = _Var7._M_current, _Var7._M_current = pIVar9 + 1, _Var7._M_current != pIVar1) {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::
              operator()((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                          *)&local_40,_Var7);
      if (!bVar3) {
        pIVar2 = pIVar9[1].m_imageList;
        (__first_00._M_current)->m_timeOfLastStatusChange =
             (_Var7._M_current)->m_timeOfLastStatusChange;
        (__first_00._M_current)->m_imageList = pIVar2;
        __first_00._M_current = __first_00._M_current + 1;
      }
    }
  }
LAB_0014c05c:
  std::
  vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
  ::erase(&this->m_lingeringImageLists,(const_iterator)__first_00._M_current,
          (this->m_lingeringImageLists).
          super__Vector_base<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::onCheckManagedResources(long long now)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    // erase-remove idiom

    auto logIt = std::remove_if(m_lingeringLogBuffers.begin(), m_lingeringLogBuffers.end(),
        [now, this](const LogBuffersLingerDefn& entry)
        {
            return now > (entry.m_timeOfLastStatusChange + m_resourceLingerTimeoutMs);
        });

    m_lingeringLogBuffers.erase(logIt, m_lingeringLogBuffers.end());

    auto arrayIt = std::remove_if(m_lingeringImageLists.begin(), m_lingeringImageLists.end(),
        [now, this](ImageListLingerDefn & entry)
        {
            if (now > (entry.m_timeOfLastStatusChange + m_resourceLingerTimeoutMs))
            {
                delete[] entry.m_imageList->m_images;
                delete entry.m_imageList;
                entry.m_imageList = nullptr;
                return true;
            }

            return false;
        });

    m_lingeringImageLists.erase(arrayIt, m_lingeringImageLists.end());
}